

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringIterator.cpp
# Opt level: O2

Var Js::JavascriptStringIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  charcount_t index;
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  char16 c;
  char16 cVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  Var aValue;
  JavascriptStringIterator *pJVar7;
  JavascriptString *pJVar8;
  DynamicObject *pDVar9;
  int iVar10;
  int in_stack_00000010;
  undefined1 local_60 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringIterator.cpp"
                                ,0x15,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc7068;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_60,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptStringIterator.cpp"
                                ,0x19,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bc7068:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  aValue = Arguments::operator[]((Arguments *)local_60,0);
  bVar3 = VarIs<Js::JavascriptStringIterator>(aValue);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf1,L"String Iterator.prototype.next");
  }
  pJVar7 = VarTo<Js::JavascriptStringIterator>(aValue);
  pJVar8 = (pJVar7->m_string).ptr;
  if (pJVar8 == (JavascriptString *)0x0) {
LAB_00bc7029:
    pDVar9 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar9;
  }
  cVar5 = JavascriptString::GetLength(pJVar8);
  index = pJVar7->m_nextIndex;
  if (cVar5 <= index) {
    (pJVar7->m_string).ptr = (JavascriptString *)0x0;
    goto LAB_00bc7029;
  }
  c = JavascriptString::GetItem(pJVar8,index);
  cVar5 = JavascriptString::GetLength(pJVar8);
  if ((index + 1 != cVar5) &&
     (bVar3 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)c), bVar3)) {
    cVar4 = JavascriptString::GetItem(pJVar8,index + 1);
    bVar3 = NumberUtilities::IsSurrogateUpperPart((uint)(ushort)cVar4);
    if (bVar3) {
      iVar10 = 2;
      pJVar8 = (JavascriptString *)JavascriptString::SubstringCore(pJVar8,index,2,pSVar1);
      goto LAB_00bc704a;
    }
  }
  pJVar8 = CharStringCache::GetStringForChar
                     (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->charStringCache,c);
  iVar10 = 1;
LAB_00bc704a:
  pJVar7->m_nextIndex = pJVar7->m_nextIndex + iVar10;
  pDVar9 = JavascriptLibrary::CreateIteratorResultObject(this,pJVar8,false);
  return pDVar9;
}

Assistant:

Var JavascriptStringIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptStringIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedStringIterator, _u("String Iterator.prototype.next"));
        }

        JavascriptStringIterator* iterator = VarTo<JavascriptStringIterator>(thisObj);
        JavascriptString* string = iterator->m_string;

        if (string == nullptr)
        {
            return library->CreateIteratorResultObjectDone();
        }

        charcount_t length = string->GetLength();
        charcount_t index = iterator->m_nextIndex;

        if (index >= length)
        {
            // Nulling out the m_string field is important so that the iterator
            // does not keep the string alive after iteration is completed.
            iterator->m_string = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        char16 chFirst = string->GetItem(index);
        Var result;

        if (index + 1 == string->GetLength() ||
            !NumberUtilities::IsSurrogateLowerPart(chFirst) ||
            !NumberUtilities::IsSurrogateUpperPart(string->GetItem(index + 1)))
        {
            result = scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(chFirst);
            iterator->m_nextIndex += 1;
        }
        else
        {
            result = JavascriptString::SubstringCore(string, index, 2, scriptContext);
            iterator->m_nextIndex += 2;
        }

        return library->CreateIteratorResultObject(result);
    }